

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O2

void ImGui_ImplOpenGL2_Shutdown(void)

{
  ImGui_ImplOpenGL2_Data *p;
  ImGuiIO *pIVar1;
  
  p = ImGui_ImplOpenGL2_GetBackendData();
  pIVar1 = ImGui::GetIO();
  ImGui_ImplOpenGL2_DestroyFontsTexture();
  pIVar1->BackendRendererName = (char *)0x0;
  pIVar1->BackendRendererUserData = (void *)0x0;
  IM_DELETE<ImGui_ImplOpenGL2_Data>(p);
  return;
}

Assistant:

void    ImGui_ImplOpenGL2_Shutdown()
{
    ImGui_ImplOpenGL2_Data* bd = ImGui_ImplOpenGL2_GetBackendData();
    IM_ASSERT(bd != nullptr && "No renderer backend to shutdown, or already shutdown?");
    ImGuiIO& io = ImGui::GetIO();

    ImGui_ImplOpenGL2_DestroyDeviceObjects();
    io.BackendRendererName = nullptr;
    io.BackendRendererUserData = nullptr;
    IM_DELETE(bd);
}